

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void last_valueFinalizeFunc(sqlite3_context *pCtx)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)sqlite3_aggregate_context(pCtx,0x10);
  if ((puVar1 != (undefined8 *)0x0) && ((sqlite3_value *)*puVar1 != (sqlite3_value *)0x0)) {
    sqlite3_result_value(pCtx,(sqlite3_value *)*puVar1);
    sqlite3ValueFree((sqlite3_value *)*puVar1);
    *puVar1 = 0;
  }
  return;
}

Assistant:

static void last_valueFinalizeFunc(sqlite3_context *pCtx){
  struct LastValueCtx *p;
  p = (struct LastValueCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p && p->pVal ){
    sqlite3_result_value(pCtx, p->pVal);
    sqlite3_value_free(p->pVal);
    p->pVal = 0;
  }
}